

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O3

void P_FloodZones(void)

{
  int iVar1;
  ReverbContainer *pRVar2;
  ulong uVar3;
  int zonenum;
  sector_t *psVar4;
  long lVar5;
  long lVar6;
  
  if (numsectors < 1) {
    numzones = 0;
    uVar3 = 0;
  }
  else {
    lVar5 = 0;
    lVar6 = 0;
    zonenum = 0;
    psVar4 = sectors;
    iVar1 = numsectors;
    do {
      if (*(short *)((long)psVar4->Portals + lVar5 + -0x14) == -1) {
        P_FloodZone((sector_t *)((long)&psVar4->planes[0].xform.xOffs + lVar5),zonenum);
        psVar4 = sectors;
        iVar1 = numsectors;
        zonenum = zonenum + 1;
      }
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x268;
    } while (lVar6 < iVar1);
    uVar3 = 0xffffffffffffffff;
    numzones = zonenum;
    if (-1 < zonenum) {
      uVar3 = (long)zonenum * 8;
    }
  }
  iVar1 = numzones;
  zones = (zone_t *)operator_new__(uVar3);
  pRVar2 = S_FindEnvironment(level.DefaultEnvironment);
  if (pRVar2 == (ReverbContainer *)0x0) {
    Printf("Sound environment %d, %d not found\n",(ulong)(uint)(level.DefaultEnvironment >> 8),
           (ulong)(level.DefaultEnvironment & 0xff));
    pRVar2 = DefaultEnvironments[0];
  }
  if (0 < iVar1) {
    uVar3 = 0;
    do {
      zones[uVar3].Environment = pRVar2;
      uVar3 = uVar3 + 1;
    } while ((uint)iVar1 != uVar3);
  }
  return;
}

Assistant:

void P_FloodZones ()
{
	int z = 0, i;
	ReverbContainer *reverb;

	for (i = 0; i < numsectors; ++i)
	{
		if (sectors[i].ZoneNumber == 0xFFFF)
		{
			P_FloodZone (&sectors[i], z++);
		}
	}
	numzones = z;
	zones = new zone_t[z];
	reverb = S_FindEnvironment(level.DefaultEnvironment);
	if (reverb == NULL)
	{
		Printf("Sound environment %d, %d not found\n", level.DefaultEnvironment >> 8, level.DefaultEnvironment & 255);
		reverb = DefaultEnvironments[0];
	}
	for (i = 0; i < z; ++i)
	{
		zones[i].Environment = reverb;
	}
}